

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_set_icc(LodePNGInfo *info,char *name,uchar *profile,uint profile_size)

{
  char *pcVar1;
  void *pvVar2;
  uint in_ECX;
  char *in_RDX;
  long in_RDI;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0xfc) != 0) {
    lodepng_clear_icc((LodePNGInfo *)0x1bfe3f);
  }
  if (in_ECX == 0) {
    local_4 = 100;
  }
  else {
    pcVar1 = alloc_string(in_RDX);
    *(char **)(in_RDI + 0x100) = pcVar1;
    if (*(long *)(in_RDI + 0x100) == 0) {
      local_4 = 0x53;
    }
    else {
      pvVar2 = lodepng_malloc(0x1bfe93);
      *(void **)(in_RDI + 0x108) = pvVar2;
      if (*(long *)(in_RDI + 0x108) == 0) {
        lodepng_free((void *)0x1bfec2);
        local_4 = 0x53;
      }
      else {
        lodepng_memcpy(*(void **)(in_RDI + 0x108),in_RDX,(ulong)in_ECX);
        *(uint *)(in_RDI + 0x110) = in_ECX;
        *(undefined4 *)(in_RDI + 0xfc) = 1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_set_icc(LodePNGInfo* info, const char* name, const unsigned char* profile, unsigned profile_size) {
  if(info->iccp_defined) lodepng_clear_icc(info);

  if(profile_size == 0) return 100; /*invalid ICC profile size*/

  info->iccp_name = alloc_string(name);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_profile = (unsigned char*)lodepng_malloc(profile_size);
  if(!info->iccp_profile) {
    lodepng_free(info->iccp_name);
    return 83; /*alloc fail*/
  }

  lodepng_memcpy(info->iccp_profile, profile, profile_size);
  info->iccp_profile_size = profile_size;
  info->iccp_defined = 1;

  return 0; /*ok*/
}